

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLParserTest_parseBooleanLiteralTest_Test::
OpenDDLParserTest_parseBooleanLiteralTest_Test(OpenDDLParserTest_parseBooleanLiteralTest_Test *this)

{
  OpenDDLParserTest_parseBooleanLiteralTest_Test *this_local;
  
  OpenDDLParserTest::OpenDDLParserTest(&this->super_OpenDDLParserTest);
  (this->super_OpenDDLParserTest).super_Test._vptr_Test =
       (_func_int **)&PTR__OpenDDLParserTest_parseBooleanLiteralTest_Test_001e2850;
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, parseBooleanLiteralTest) {
    char *in(nullptr);
    Value *data(nullptr);
    size_t len1(0);
    char token1[] = "true", *end1(findEnd(token1, len1));
    in = OpenDDLParser::parseBooleanLiteral(token1, end1, &data);
    ASSERT_FALSE(nullptr == in);
    ASSERT_FALSE(nullptr == data);
    EXPECT_EQ(Value::ValueType::ddl_bool, data->m_type);
    EXPECT_EQ(true, data->getBool());
    registerValueForDeletion(data);

    size_t len2(0);
    char token2[] = "false", *end2(findEnd(token2, len2));
    in = OpenDDLParser::parseBooleanLiteral(token2, end2, &data);
    ASSERT_FALSE(nullptr == data);
    EXPECT_EQ(Value::ValueType::ddl_bool, data->m_type);
    EXPECT_FALSE(data->getBool());
    registerValueForDeletion(data);

    size_t len3(0);
    char token3[] = "fallse", *end3(findEnd(token3, len3));
    in = OpenDDLParser::parseBooleanLiteral(token3, end3, &data);
    EXPECT_EQ(nullptr, data);
}